

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O3

void __thiscall
cs_impl::cni_holder<char_(*)(),_char_(*)()>::cni_holder
          (cni_holder<char_(*)(),_char_(*)()> *this,_func_char **func)

{
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  (this->super_cni_holder_base)._vptr_cni_holder_base = (_func_int **)&PTR__cni_holder_00253e78;
  local_18 = (code *)0x0;
  pcStack_10 = (code *)0x0;
  local_28._M_unused._M_object = (_func_char *)0x0;
  local_28._8_8_ = 0;
  if (*func != (_func_char *)0x0) {
    pcStack_10 = std::_Function_handler<char_(),_char_(*)()>::_M_invoke;
    local_18 = std::_Function_handler<char_(),_char_(*)()>::_M_manager;
    local_28._M_unused._0_8_ = (undefined8)*func;
  }
  std::function<char_()>::function(&(this->mCni).mFunc,(function<char_()> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}